

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprc_identity(lys_ypr_ctx *pctx,lysc_ident *ident)

{
  uint16_t *puVar1;
  ly_bool *flag_00;
  uint uVar2;
  lysc_ident **pplVar3;
  ly_out *out;
  LY_ERR LVar4;
  ulong in_RAX;
  lysc_ident *plVar5;
  ulong uVar6;
  lysc_ident *plVar7;
  ly_bool flag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  uVar6 = 0;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
      (undefined1  [24])0x0) {
    uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
  }
  ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",uVar6,"",ident->name);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprc_extension_instances(pctx,LY_STMT_IDENTITY,'\0',ident->exts,(ly_bool *)((long)&uStack_38 + 7))
  ;
  if (uStack_38._7_1_ == '\0') {
    uStack_38 = CONCAT17(1,(undefined7)uStack_38);
    ly_print_((pctx->field_0).field_0.out," {\n");
  }
  LVar4 = lys_identity_iffeature_value(ident);
  if (LVar4 == LY_ENOT) {
    uVar6 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*s/* identity \"%s\" is disabled by if-feature(s) */\n",
              uVar6,"",ident->name);
  }
  plVar7 = (lysc_ident *)0x0;
  while( true ) {
    pplVar3 = ident->derived;
    if (pplVar3 == (lysc_ident **)0x0) {
      plVar5 = (lysc_ident *)0x0;
    }
    else {
      plVar5 = pplVar3[-1];
    }
    if (plVar5 <= plVar7) break;
    plVar5 = pplVar3[(long)plVar7];
    out = (pctx->field_0).field_0.out;
    uVar2 = (pctx->field_0).field_0.options;
    if ((pctx->field_0).field_0.module == plVar5->module) {
      uVar6 = 0;
      if ((uVar2 & 2) == 0) {
        uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_(out,"%*sderived %s;\n",uVar6,"",plVar5->name);
    }
    else {
      uVar6 = 0;
      if ((uVar2 & 2) == 0) {
        uVar6 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_(out,"%*sderived %s:%s;\n",uVar6,"",plVar5->module->prefix,plVar5->name);
    }
    plVar7 = (lysc_ident *)((long)&plVar7->name + 1);
  }
  flag_00 = (ly_bool *)((long)&uStack_38 + 7);
  ypr_status(pctx,ident->flags,ident->exts,flag_00);
  ypr_description(pctx,ident->dsc,ident->exts,flag_00);
  ypr_reference(pctx,ident->ref,ident->exts,flag_00);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,uStack_38._7_1_);
  return;
}

Assistant:

static void
yprc_identity(struct lys_ypr_ctx *pctx, const struct lysc_ident *ident)
{
    ly_bool flag = 0;
    LY_ARRAY_COUNT_TYPE u;

    ly_print_(pctx->out, "%*sidentity %s", INDENT, ident->name);
    LEVEL++;

    yprc_extension_instances(pctx, LY_STMT_IDENTITY, 0, ident->exts, &flag);

    ypr_open(pctx->out, &flag);
    if (lys_identity_iffeature_value(ident) == LY_ENOT) {
        ly_print_(pctx->out, "%*s/* identity \"%s\" is disabled by if-feature(s) */\n", INDENT, ident->name);
    }

    LY_ARRAY_FOR(ident->derived, u) {
        if (pctx->module != ident->derived[u]->module) {
            ly_print_(pctx->out, "%*sderived %s:%s;\n", INDENT, ident->derived[u]->module->prefix, ident->derived[u]->name);
        } else {
            ly_print_(pctx->out, "%*sderived %s;\n", INDENT, ident->derived[u]->name);
        }
    }

    ypr_status(pctx, ident->flags, ident->exts, &flag);
    ypr_description(pctx, ident->dsc, ident->exts, &flag);
    ypr_reference(pctx, ident->ref, ident->exts, &flag);

    LEVEL--;
    ypr_close(pctx, flag);
}